

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFunctions.h
# Opt level: O3

bool OpenFileForReading<char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename,
               FFHANDLE *handle)

{
  pointer pcVar1;
  FILE *pFVar2;
  long *local_48 [2];
  long local_38 [2];
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + filename->_M_string_length);
  pFVar2 = fopen((char *)local_48[0],"r");
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  if (pFVar2 == (FILE *)0x0) {
    pcVar1 = (filename->_M_dataplus)._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + filename->_M_string_length);
    error("fopen(%s)",local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
    }
  }
  else {
    *handle = (FFHANDLE)pFVar2;
  }
  return pFVar2 != (FILE *)0x0;
}

Assistant:

bool OpenFileForReading(const std::basic_string<T>& filename, FFHANDLE& handle)
{
#ifdef _WIN32
    FFHANDLE h= CreateFile(ToTString(filename).c_str(), GENERIC_READ, FILE_SHARE_READ,
                NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (h==INVALID_HANDLE_VALUE || h==NULL)
    {
        logerror("CreateFile(%ls, READ)", filename.c_str());
        return false;
    }
    handle= h;

#endif
#ifdef _UNIX
    FILE *f= fopen(ToString(filename).c_str(), "r");
    if (f==NULL) {
        logerror("fopen(%s)", ToString(filename).c_str());
        return false;
    }
    handle= f;
#endif
    return true;
}